

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O1

int __thiscall
YAML::RegEx::MatchUnchecked<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  size_t sVar1;
  Stream *pSVar2;
  _Elt_pointer pcVar3;
  RegEx *pRVar4;
  pointer pRVar5;
  uint uVar6;
  int iVar7;
  _Elt_pointer pcVar8;
  char *pcVar9;
  uint uVar10;
  pointer pRVar11;
  ulong uVar12;
  RegEx *param;
  long lVar13;
  RegEx *pRVar14;
  StreamCharSource local_40;
  
  uVar6 = 0xffffffff;
  uVar10 = uVar6;
  switch(this->m_op) {
  case REGEX_EMPTY:
    pSVar2 = source->m_stream;
    pcVar3 = (pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar8 = pcVar3 + (source->m_offset -
                      (long)(pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if (pcVar8 < (_Elt_pointer)0x200) {
      pcVar9 = pcVar3 + source->m_offset;
    }
    else {
      uVar12 = (ulong)pcVar8 >> 9 | 0xff80000000000000;
      if (0 < (long)pcVar8) {
        uVar12 = (ulong)pcVar8 >> 9;
      }
      pcVar9 = (pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar12] + (long)(pcVar8 + uVar12 * -0x200);
    }
    uVar10 = -(uint)(*pcVar9 != '\x04');
    break;
  case REGEX_MATCH:
    pSVar2 = source->m_stream;
    pcVar3 = (pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar8 = pcVar3 + (source->m_offset -
                      (long)(pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if (pcVar8 < (_Elt_pointer)0x200) {
      pcVar9 = pcVar3 + source->m_offset;
    }
    else {
      uVar12 = (ulong)pcVar8 >> 9 | 0xff80000000000000;
      if (0 < (long)pcVar8) {
        uVar12 = (ulong)pcVar8 >> 9;
      }
      pcVar9 = (pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar12] + (long)(pcVar8 + uVar12 * -0x200);
    }
    uVar10 = (uint)(*pcVar9 == this->m_a) * 2 - 1;
    break;
  case REGEX_RANGE:
    sVar1 = source->m_offset;
    pSVar2 = source->m_stream;
    pcVar3 = (pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar8 = pcVar3 + (sVar1 - (long)(pSVar2->m_readahead).
                                     super__Deque_base<char,_std::allocator<char>_>._M_impl.
                                     super__Deque_impl_data._M_start._M_first);
    if (pcVar8 < (_Elt_pointer)0x200) {
      pcVar9 = pcVar3 + sVar1;
    }
    else {
      uVar12 = (ulong)pcVar8 >> 9 | 0xff80000000000000;
      if (0 < (long)pcVar8) {
        uVar12 = (ulong)pcVar8 >> 9;
      }
      pcVar9 = (pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar12] + (long)(pcVar8 + uVar12 * -0x200);
    }
    if (this->m_a <= *pcVar9) {
      if (pcVar8 < (_Elt_pointer)0x200) {
        pcVar9 = pcVar3 + sVar1;
      }
      else {
        uVar12 = (ulong)pcVar8 >> 9 | 0xff80000000000000;
        if (0 < (long)pcVar8) {
          uVar12 = (ulong)pcVar8 >> 9;
        }
        pcVar9 = (pSVar2->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                 super__Deque_impl_data._M_start._M_node[uVar12] + (long)(pcVar8 + uVar12 * -0x200);
      }
      uVar10 = (uint)(*pcVar9 <= this->m_z) * 2 - 1;
    }
    break;
  case REGEX_OR:
    pRVar14 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    pRVar4 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while ((uVar10 = uVar6, pRVar14 != pRVar4 &&
           (uVar10 = MatchUnchecked<YAML::StreamCharSource>(pRVar14,source), (int)uVar10 < 0))) {
      pRVar14 = pRVar14 + 1;
    }
    break;
  case REGEX_AND:
    pRVar11 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar11) {
      lVar13 = 0;
      uVar12 = 0;
      do {
        uVar10 = MatchUnchecked<YAML::StreamCharSource>
                           ((RegEx *)((long)&pRVar11->m_op + lVar13),source);
        if (uVar10 == 0xffffffff) {
          return 0xffffffff;
        }
        if (uVar12 == 0) {
          uVar6 = uVar10;
        }
        uVar12 = uVar12 + 1;
        pRVar11 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x20;
        uVar10 = uVar6;
      } while (uVar12 < (ulong)((long)(this->m_params).
                                      super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pRVar11 >> 5
                               ));
    }
    break;
  case REGEX_NOT:
    pRVar14 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (pRVar14 !=
        (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar6 = MatchUnchecked<YAML::StreamCharSource>(pRVar14,source);
      uVar10 = (int)~uVar6 >> 0x1f | 1;
    }
    break;
  case REGEX_SEQ:
    pRVar11 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    pRVar5 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pRVar11 == pRVar5) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      do {
        local_40.m_stream = source->m_stream;
        local_40.m_offset = source->m_offset + (long)(int)uVar10;
        if ((int)(uVar10 + (int)source->m_offset) < 0) {
          local_40.m_offset = 0;
        }
        iVar7 = Match<YAML::StreamCharSource>(pRVar11,&local_40);
        if (iVar7 == -1) {
          return 0xffffffff;
        }
        uVar10 = iVar7 + uVar10;
        pRVar11 = pRVar11 + 1;
      } while (pRVar11 != pRVar5);
    }
  }
  return uVar10;
}

Assistant:

inline int RegEx::MatchUnchecked(const Source& source) const {
  switch (m_op) {
    case REGEX_EMPTY:
      return MatchOpEmpty(source);
    case REGEX_MATCH:
      return MatchOpMatch(source);
    case REGEX_RANGE:
      return MatchOpRange(source);
    case REGEX_OR:
      return MatchOpOr(source);
    case REGEX_AND:
      return MatchOpAnd(source);
    case REGEX_NOT:
      return MatchOpNot(source);
    case REGEX_SEQ:
      return MatchOpSeq(source);
  }

  return -1;
}